

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyRender.cpp
# Opt level: O3

void __thiscall
TRM::TinyRender::triangle(TinyRender *this,Vec2i *a,Vec2i *b,Vec2i *c,TGAColor *color)

{
  vec<2,_float,_(glm::qualifier)0> A;
  vec<2,_float,_(glm::qualifier)0> P;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  vec<2,_float,_(glm::qualifier)0> B;
  vec<2,_float,_(glm::qualifier)0> C;
  Vec3f VVar11;
  Vec2i pts [3];
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 local_68;
  int iStack_64;
  Vec2i local_60;
  Vec2i local_58;
  undefined1 local_48 [16];
  
  _local_68 = *a;
  local_60 = *b;
  local_58 = *c;
  iVar1 = TGAImage::get_width(*(TGAImage **)(this + 8));
  iVar1 = iVar1 + -1;
  iVar2 = TGAImage::get_height(*(TGAImage **)(this + 8));
  iVar2 = iVar2 + -1;
  iVar3 = TGAImage::get_width(*(TGAImage **)(this + 8));
  iVar4 = TGAImage::get_height(*(TGAImage **)(this + 8));
  iVar4 = iVar4 + -1;
  iVar6 = 0;
  lVar5 = 0;
  iVar9 = 0;
  do {
    iVar8 = iVar9;
    iVar7 = *(int *)((long)&iStack_64 + lVar5 * 8);
    if (iVar7 < iVar2) {
      iVar2 = iVar7;
    }
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    iVar9 = (&local_68)[lVar5 * 2].x;
    if (iVar6 <= iVar9) {
      iVar6 = iVar9;
    }
    if (iVar3 + -1 <= iVar6) {
      iVar6 = iVar3 + -1;
    }
    if (iVar9 < iVar1) {
      iVar1 = iVar9;
    }
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    iVar9 = iVar7;
    if (iVar7 < iVar8) {
      iVar9 = iVar8;
    }
    if (iVar4 <= iVar9) {
      iVar9 = iVar4;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  if (iVar1 <= iVar6) {
    if (iVar7 < iVar8) {
      iVar7 = iVar8;
    }
    if (iVar4 <= iVar7) {
      iVar7 = iVar4;
    }
    do {
      if (iVar2 <= iVar9) {
        local_48 = ZEXT416((uint)(float)iVar1);
        iVar3 = iVar2;
        do {
          B.field_0.x = (float)(*b).field_0.x;
          B.field_1.y = (float)(*b).field_1.y;
          C.field_0.x = (float)(*c).field_0.x;
          C.field_1.y = (float)(*c).field_1.y;
          A.field_1.y = (float)(*a).field_1.y;
          A.field_0.x = (float)(*a).field_0.x;
          P.field_1.y = (float)iVar3;
          P.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)local_48._0_4_
          ;
          VVar11 = barycentric<2ul>(A,B,C,P);
          if (((0.0 <= VVar11.field_0.x) && (0.0 <= VVar11.field_1.y)) && (0.0 <= VVar11.field_2.z))
          {
            TGAImage::set(*(TGAImage **)(this + 8),iVar1,iVar3,color);
          }
          iVar3 = iVar3 + 1;
        } while (iVar7 + 1 != iVar3);
      }
      bVar10 = iVar1 != iVar6;
      iVar1 = iVar1 + 1;
    } while (bVar10);
  }
  return;
}

Assistant:

void TinyRender::triangle(const Vec2i& a, const Vec2i& b, const Vec2i& c,
                          const TGAColor& color) {
  Vec2i pts[] = {a, b, c};

  Vec2i bboxmin(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  Vec2i bboxmax(0, 0);
  Vec2i clamp(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 2; j++) {
      bboxmin[j] = std::max(0, std::min(bboxmin[j], pts[i][j]));
      bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
    }
  }

  Vec2i p;
  for (p[0] = bboxmin.x; p[0] <= bboxmax.x; p[0]++) {
    for (p[1] = bboxmin.y; p[1] <= bboxmax.y; p[1]++) {
      Vec3f bc_screen = barycentric<2>(a, b, c, p);
      if (bc_screen[0] < 0 || bc_screen[1] < 0 || bc_screen[2] < 0) continue;

      mImage->set(p[0], p[1], color);
    }
  }
}